

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_complex_copy(sexp ctx,sexp a)

{
  sexp psVar1;
  sexp in_RSI;
  sexp in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp_conflict *local_28;
  sexp image;
  sexp psVar2;
  
  psVar2 = (sexp)&DAT_0000043e;
  memset(&local_28,0,0x10);
  local_28 = (sexp_conflict *)&stack0xffffffffffffffe8;
  image = (sexp)(in_RDI->value).context.saves;
  (in_RDI->value).context.saves = (sexp_gc_var_t *)&local_28;
  psVar2 = sexp_make_complex(in_RSI,psVar2,image);
  if ((((in_RSI->value).stack.length & 3) == 0) && (((in_RSI->value).type.name)->tag == 0xb)) {
    psVar1 = sexp_make_flonum(psVar2,(double)image);
    (in_RSI->value).type.name = psVar1;
  }
  else if ((((in_RSI->value).stack.length & 3) == 0) && (((in_RSI->value).type.name)->tag == 0xc)) {
    psVar1 = sexp_copy_bignum((sexp)__sexp_gc_preserver1.var,in_RDI,in_RSI,(sexp_uint_t)psVar2);
    (in_RSI->value).type.name = psVar1;
  }
  if ((((in_RSI->value).string.offset & 3) == 0) && (((in_RSI->value).type.cpl)->tag == 0xb)) {
    psVar1 = sexp_make_flonum(psVar2,(double)image);
    (in_RSI->value).type.cpl = psVar1;
  }
  else if ((((in_RSI->value).string.offset & 3) == 0) && (((in_RSI->value).type.cpl)->tag == 0xc)) {
    psVar1 = sexp_copy_bignum((sexp)__sexp_gc_preserver1.var,in_RDI,in_RSI,(sexp_uint_t)psVar2);
    (in_RSI->value).type.cpl = psVar1;
  }
  (in_RDI->value).context.saves = (sexp_gc_var_t *)image;
  return psVar2;
}

Assistant:

static sexp sexp_complex_copy (sexp ctx, sexp a) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_make_complex(ctx, sexp_complex_real(a), sexp_complex_imag(a));
  if (sexp_flonump(sexp_complex_real(a)))
    sexp_complex_real(a) = sexp_make_flonum(ctx, sexp_flonum_value(sexp_complex_real(a)));
  else if (sexp_bignump(sexp_complex_real(a)))
    sexp_complex_real(a) = sexp_copy_bignum(ctx, NULL, sexp_complex_real(a), 0);
  if (sexp_flonump(sexp_complex_imag(a)))
    sexp_complex_imag(a) = sexp_make_flonum(ctx, sexp_flonum_value(sexp_complex_imag(a)));
  else if (sexp_bignump(sexp_complex_imag(a)))
    sexp_complex_imag(a) = sexp_copy_bignum(ctx, NULL, sexp_complex_imag(a), 0);
  sexp_gc_release1(ctx);
  return res;
}